

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O2

int QCollator::defaultCompare(QStringView s1,QStringView s2)

{
  int iVar1;
  Type *this;
  GenerationalCollator *this_00;
  
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>_>::
         operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>_>
                     *)s1.m_size);
  this_00 = QThreadStorage<(anonymous_namespace)::GenerationalCollator>::localData(this);
  anon_unknown.dwarf_b00545::GenerationalCollator::collator(this_00);
  iVar1 = compare(&this_00->theCollator,s1,s2);
  return iVar1;
}

Assistant:

int QCollator::defaultCompare(QStringView s1, QStringView s2)
{
    return defaultCollator->localData().collator().compare(s1, s2);
}